

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MergePrefixLists(Fts5Index *p,Fts5Buffer *p1,Fts5Buffer *p2)

{
  ulong uVar1;
  i64 iVar2;
  i64 iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int *pRc;
  ulong iPos;
  size_t __n;
  ulong iPos_00;
  u8 *puVar10;
  u8 *puVar11;
  Fts5Buffer *pBuf;
  int iOff2;
  int iOff1;
  i64 iPrev;
  i64 iPos2;
  i64 iPos1;
  Fts5Buffer tmp;
  Fts5DoclistIter i2;
  Fts5DoclistIter i1;
  int local_e0;
  int local_dc;
  ulong local_d8;
  u8 *local_d0;
  ulong local_c8;
  ulong local_c0;
  Fts5Buffer local_b8;
  long local_a8;
  ulong local_a0;
  Fts5DoclistIter local_98;
  Fts5Buffer local_78;
  Fts5DoclistIter local_68;
  Fts5Buffer *local_48;
  u8 *local_40;
  int *local_38;
  
  if (p2->n == 0) {
    return;
  }
  local_78.p = (u8 *)0x0;
  local_78.n = 0;
  local_78.nSpace = 0;
  local_b8.p = (u8 *)0x0;
  local_b8.n = 0;
  local_b8.nSpace = 0;
  pRc = &p->rc;
  iVar4 = sqlite3Fts5BufferSize(pRc,&local_78,p2->n + p1->n + 9);
  if (iVar4 != 0) {
    return;
  }
  local_48 = p1;
  fts5DoclistIterInit(p1,&local_68);
  fts5DoclistIterInit(p2,&local_98);
  local_d0 = local_78.p;
  lVar7 = 0;
  iVar4 = local_78.n;
  local_38 = pRc;
  do {
    while( true ) {
      while( true ) {
        puVar10 = local_68.aPoslist;
        iVar3 = local_68.iRowid;
        iVar2 = local_98.iRowid;
        puVar11 = local_d0;
        if (local_98.iRowid <= local_68.iRowid) break;
        iVar5 = sqlite3Fts5PutVarint(local_d0 + iVar4,local_68.iRowid - lVar7);
        lVar7 = (long)local_68.nPoslist;
        lVar9 = (long)local_68.nSize;
        memcpy(puVar11 + (iVar4 + iVar5),local_68.aPoslist,lVar9 + lVar7);
        iVar4 = iVar4 + iVar5 + (int)(lVar9 + lVar7);
        fts5DoclistIterNext(&local_68);
        lVar7 = iVar3;
        if (local_68.aPoslist == (u8 *)0x0) {
          local_a8 = iVar3;
          puVar10 = (u8 *)0x0;
          goto LAB_00191741;
        }
      }
      if (local_68.iRowid != local_98.iRowid) break;
      local_c0 = 0;
      local_c8 = 0;
      local_dc = 0;
      local_e0 = 0;
      puVar11 = local_98.aPoslist + local_98.nSize;
      local_d8 = 0;
      lVar9 = (long)local_68.nSize;
      local_a8 = local_68.iRowid;
      iVar6 = sqlite3Fts5PutVarint(local_d0 + iVar4,local_68.iRowid - lVar7);
      iVar5 = local_68.nPoslist;
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
      iVar4 = iVar4 + iVar6;
      local_a0 = (ulong)(uint)local_98.nPoslist;
      sqlite3Fts5BufferSize(pRc,&local_b8,local_98.nPoslist + local_68.nPoslist);
      if (*pRc != 0) goto LAB_00191741;
      puVar10 = puVar10 + lVar9;
      sqlite3Fts5PoslistNext64(puVar10,iVar5,&local_dc,(i64 *)&local_c0);
      sqlite3Fts5PoslistNext64(puVar11,(int)local_a0,&local_e0,(i64 *)&local_c8);
      iPos = local_c0;
      iPos_00 = local_c8;
      local_40 = puVar11;
      if ((long)local_c0 < (long)local_c8) {
        sqlite3Fts5PoslistSafeAppend(&local_b8,(i64 *)&local_d8,local_c0);
        sqlite3Fts5PoslistNext64(puVar10,iVar5,&local_dc,(i64 *)&local_c0);
        iPos = local_c0;
      }
      else {
        sqlite3Fts5PoslistSafeAppend(&local_b8,(i64 *)&local_d8,local_c8);
        sqlite3Fts5PoslistNext64(puVar11,(int)local_a0,&local_e0,(i64 *)&local_c8);
        iPos_00 = local_c8;
      }
      puVar11 = local_40;
      uVar1 = iPos | iPos_00;
      while (-1 < (long)uVar1) {
        while ((long)iPos < (long)iPos_00) {
          if (iPos != local_d8) {
            sqlite3Fts5PoslistSafeAppend(&local_b8,(i64 *)&local_d8,iPos);
          }
          sqlite3Fts5PoslistNext64(puVar10,iVar5,&local_dc,(i64 *)&local_c0);
          iPos = local_c0;
          if ((long)local_c0 < 0) goto LAB_00191668;
        }
        sqlite3Fts5PoslistSafeAppend(&local_b8,(i64 *)&local_d8,iPos_00);
        sqlite3Fts5PoslistNext64(puVar11,(int)local_a0,&local_e0,(i64 *)&local_c8);
        iPos_00 = local_c8;
        uVar1 = local_c8;
      }
      if ((long)iPos < 0) {
LAB_00191668:
        sqlite3Fts5PoslistSafeAppend(&local_b8,(i64 *)&local_d8,iPos_00);
        puVar11 = puVar11 + local_e0;
        uVar8 = (int)local_a0 - local_e0;
      }
      else {
        if (iPos != local_d8) {
          sqlite3Fts5PoslistSafeAppend(&local_b8,(i64 *)&local_d8,iPos);
        }
        puVar11 = puVar10 + local_dc;
        uVar8 = iVar5 - local_dc;
      }
      pRc = local_38;
      puVar10 = local_b8.p;
      iVar5 = local_b8.n;
      if (0 < (int)uVar8) {
        memcpy(local_b8.p + local_b8.n,puVar11,(ulong)uVar8);
        iVar5 = iVar5 + uVar8;
        local_b8.n = iVar5;
      }
      puVar11 = local_d0;
      iVar6 = sqlite3Fts5PutVarint(local_d0 + iVar4,(long)(iVar5 * 2));
      memcpy(puVar11 + (iVar4 + iVar6),puVar10,(long)iVar5);
      iVar4 = iVar5 + iVar4 + iVar6;
      fts5DoclistIterNext(&local_68);
      fts5DoclistIterNext(&local_98);
      puVar10 = local_68.aPoslist;
      if ((local_68.aPoslist == (u8 *)0x0) || (lVar7 = local_a8, local_98.aPoslist == (u8 *)0x0))
      goto LAB_00191741;
    }
    iVar5 = sqlite3Fts5PutVarint(local_d0 + iVar4,local_98.iRowid - lVar7);
    lVar7 = (long)local_98.nPoslist;
    lVar9 = (long)local_98.nSize;
    memcpy(puVar11 + (iVar4 + iVar5),local_98.aPoslist,lVar9 + lVar7);
    iVar4 = iVar4 + iVar5 + (int)(lVar9 + lVar7);
    fts5DoclistIterNext(&local_98);
    lVar7 = iVar2;
  } while (local_98.aPoslist != (u8 *)0x0);
  local_a8 = iVar2;
  puVar10 = local_68.aPoslist;
LAB_00191741:
  pBuf = local_48;
  puVar11 = local_d0;
  local_78.n = iVar4;
  if (puVar10 == (u8 *)0x0) {
    if (local_98.aPoslist == (u8 *)0x0) goto LAB_001917e5;
    iVar5 = sqlite3Fts5PutVarint(local_d0 + iVar4,local_98.iRowid - local_a8);
    iVar5 = iVar5 + iVar4;
    __n = (long)local_98.aEof - (long)local_98.aPoslist;
    memcpy(puVar11 + iVar5,local_98.aPoslist,__n);
  }
  else {
    iVar5 = sqlite3Fts5PutVarint(local_d0 + iVar4,local_68.iRowid - local_a8);
    iVar5 = iVar5 + iVar4;
    __n = (long)local_68.aEof - (long)puVar10;
    memcpy(puVar11 + iVar5,puVar10,__n);
    pBuf = local_48;
  }
  iVar4 = (int)__n + iVar5;
  local_78.n = iVar4;
LAB_001917e5:
  sqlite3Fts5BufferSet(pRc,pBuf,iVar4,local_d0);
  sqlite3Fts5BufferFree(&local_b8);
  sqlite3Fts5BufferFree(&local_78);
  return;
}

Assistant:

static void fts5MergePrefixLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  Fts5Buffer *p2                  /* Second list to merge */
){
  if( p2->n ){
    i64 iLastRowid = 0;
    Fts5DoclistIter i1;
    Fts5DoclistIter i2;
    Fts5Buffer out = {0, 0, 0};
    Fts5Buffer tmp = {0, 0, 0};

    /* The maximum size of the output is equal to the sum of the two 
    ** input sizes + 1 varint (9 bytes). The extra varint is because if the
    ** first rowid in one input is a large negative number, and the first in
    ** the other a non-negative number, the delta for the non-negative
    ** number will be larger on disk than the literal integer value
    ** was.  */
    if( sqlite3Fts5BufferSize(&p->rc, &out, p1->n + p2->n + 9) ) return;
    fts5DoclistIterInit(p1, &i1);
    fts5DoclistIterInit(p2, &i2);

    while( 1 ){
      if( i1.iRowid<i2.iRowid ){
        /* Copy entry from i1 */
        fts5MergeAppendDocid(&out, iLastRowid, i1.iRowid);
        fts5BufferSafeAppendBlob(&out, i1.aPoslist, i1.nPoslist+i1.nSize);
        fts5DoclistIterNext(&i1);
        if( i1.aPoslist==0 ) break;
      }
      else if( i2.iRowid!=i1.iRowid ){
        /* Copy entry from i2 */
        fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
        fts5BufferSafeAppendBlob(&out, i2.aPoslist, i2.nPoslist+i2.nSize);
        fts5DoclistIterNext(&i2);
        if( i2.aPoslist==0 ) break;
      }
      else{
        /* Merge the two position lists. */ 
        i64 iPos1 = 0;
        i64 iPos2 = 0;
        int iOff1 = 0;
        int iOff2 = 0;
        u8 *a1 = &i1.aPoslist[i1.nSize];
        u8 *a2 = &i2.aPoslist[i2.nSize];
        int nCopy;
        u8 *aCopy;

        i64 iPrev = 0;
        Fts5PoslistWriter writer;
        memset(&writer, 0, sizeof(writer));

        fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
        fts5BufferZero(&tmp);
        sqlite3Fts5BufferSize(&p->rc, &tmp, i1.nPoslist + i2.nPoslist);
        if( p->rc ) break;

        sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
        sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
        assert( iPos1>=0 && iPos2>=0 );

        if( iPos1<iPos2 ){
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
          sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
        }else{
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
          sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
        }

        if( iPos1>=0 && iPos2>=0 ){
          while( 1 ){
            if( iPos1<iPos2 ){
              if( iPos1!=iPrev ){
                sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
              }
              sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
              if( iPos1<0 ) break;
            }else{
              assert_nc( iPos2!=iPrev );
              sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
              sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
              if( iPos2<0 ) break;
            }
          }
        }

        if( iPos1>=0 ){
          if( iPos1!=iPrev ){
            sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
          }
          aCopy = &a1[iOff1];
          nCopy = i1.nPoslist - iOff1;
        }else{
          assert( iPos2>=0 && iPos2!=iPrev );
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
          aCopy = &a2[iOff2];
          nCopy = i2.nPoslist - iOff2;
        }
        if( nCopy>0 ){
          fts5BufferSafeAppendBlob(&tmp, aCopy, nCopy);
        }

        /* WRITEPOSLISTSIZE */
        fts5BufferSafeAppendVarint(&out, tmp.n * 2);
        fts5BufferSafeAppendBlob(&out, tmp.p, tmp.n);
        fts5DoclistIterNext(&i1);
        fts5DoclistIterNext(&i2);
        assert( out.n<=(p1->n+p2->n+9) );
        if( i1.aPoslist==0 || i2.aPoslist==0 ) break;
      }
    }

    if( i1.aPoslist ){
      fts5MergeAppendDocid(&out, iLastRowid, i1.iRowid);
      fts5BufferSafeAppendBlob(&out, i1.aPoslist, i1.aEof - i1.aPoslist);
    }
    else if( i2.aPoslist ){
      fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
      fts5BufferSafeAppendBlob(&out, i2.aPoslist, i2.aEof - i2.aPoslist);
    }
    assert( out.n<=(p1->n+p2->n+9) );

    fts5BufferSet(&p->rc, p1, out.n, out.p);
    fts5BufferFree(&tmp);
    fts5BufferFree(&out);
  }
}